

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

TPZVec<void_*> * __thiscall TPZVec<void_*>::operator=(TPZVec<void_*> *this,TPZVec<void_*> *rval)

{
  ulong uVar1;
  void **ppvVar2;
  ulong uVar3;
  
  if (this != rval) {
    this->fNElements = rval->fNElements;
    if (this->fStore != (void **)0x0) {
      operator_delete__(this->fStore);
    }
    if (rval->fNAlloc == 0) {
      uVar1 = this->fNElements;
      ppvVar2 = (void **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
      this->fStore = ppvVar2;
      if (0 < (long)uVar1) {
        uVar3 = 0;
        do {
          this->fStore[uVar3] = rval->fStore[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
    }
    else {
      this->fStore = rval->fStore;
    }
    this->fNAlloc = this->fNElements;
    rval->fStore = (void **)0x0;
    rval->fNElements = 0;
    rval->fNAlloc = 0;
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(TPZVec<T> &&rval){
	if(this != &rval){
        fNElements = rval.fNElements;
        if(fStore) delete [] fStore;
        if(rval.fNAlloc){
            fStore = rval.fStore;
        }else{
            fStore = new T[fNElements];
            for (int64_t i = 0; i < fNElements; i++)
                fStore[i] = rval.fStore[i];
        }
        fNAlloc = fNElements;//perhaps rval.fNalloc was 0
        rval.fStore = nullptr;
        rval.fNElements = 0;
        rval.fNAlloc = 0;
	}
	return *this;
}